

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void Cmd_atexit(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  GameAtExit *pGVar4;
  GameAtExit *record_1;
  GameAtExit *pGStack_28;
  int i;
  GameAtExit *record;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Registered atexit commands:\n");
    for (pGStack_28 = ExitCmdList; pGStack_28 != (GameAtExit *)0x0; pGStack_28 = pGStack_28->Next) {
      Printf("%s\n",pGStack_28->Command);
    }
  }
  else {
    for (record_1._4_4_ = 1; iVar1 = FCommandLine::argc(argv), record_1._4_4_ < iVar1;
        record_1._4_4_ = record_1._4_4_ + 1) {
      pcVar2 = FCommandLine::operator[](argv,record_1._4_4_);
      sVar3 = strlen(pcVar2);
      pGVar4 = (GameAtExit *)
               M_Malloc_Dbg(sVar3 + 0x10,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_console.cpp"
                            ,0x184);
      pcVar2 = FCommandLine::operator[](argv,record_1._4_4_);
      strcpy(pGVar4->Command,pcVar2);
      pGVar4->Next = ExitCmdList;
      ExitCmdList = pGVar4;
    }
  }
  return;
}

Assistant:

CCMD (atexit)
{
	if (argv.argc() == 1)
	{
		Printf ("Registered atexit commands:\n");
		GameAtExit *record = ExitCmdList;
		while (record != NULL)
		{
			Printf ("%s\n", record->Command);
			record = record->Next;
		}
		return;
	}
	for (int i = 1; i < argv.argc(); ++i)
	{
		GameAtExit *record = (GameAtExit *)M_Malloc (
			sizeof(GameAtExit)+strlen(argv[i]));
		strcpy (record->Command, argv[i]);
		record->Next = ExitCmdList;
		ExitCmdList = record;
	}
}